

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellReissner4::~ChElementShellReissner4(ChElementShellReissner4 *this)

{
  ~ChElementShellReissner4(this,&VTT);
  free(*(void **)&this[-1].field_0xcdf8);
  return;
}

Assistant:

void ChElementShellReissner4::SetNodes(std::shared_ptr<ChNodeFEAxyzrot> nodeA,
                                       std::shared_ptr<ChNodeFEAxyzrot> nodeB,
                                       std::shared_ptr<ChNodeFEAxyzrot> nodeC,
                                       std::shared_ptr<ChNodeFEAxyzrot> nodeD) {
    assert(nodeA);
    assert(nodeB);
    assert(nodeC);
    assert(nodeD);

    m_nodes[0] = nodeA;
    m_nodes[1] = nodeB;
    m_nodes[2] = nodeC;
    m_nodes[3] = nodeD;
    std::vector<ChVariables*> mvars;
    mvars.push_back(&m_nodes[0]->Variables());
    mvars.push_back(&m_nodes[1]->Variables());
    mvars.push_back(&m_nodes[2]->Variables());
    mvars.push_back(&m_nodes[3]->Variables());
    Kmatr.SetVariables(mvars);
}